

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshIO.hh
# Opt level: O2

bool OpenMesh::IO::read_mesh<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>>
               (PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits> *_mesh,string *_filename,
               Options *_opt,bool _clear)

{
  undefined1 uVar1;
  _IOManager_ *this;
  undefined7 in_register_00000009;
  IO *this_00;
  ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> importer;
  ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> local_58;
  
  this_00 = (IO *)_mesh;
  if ((int)CONCAT71(in_register_00000009,_clear) != 0) {
    ArrayKernel::clear((ArrayKernel *)_mesh);
  }
  local_58.halfedgeNormals_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58.halfedgeNormals_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_58.super_BaseImporter._vptr_BaseImporter = (_func_int **)&PTR__ImporterT_001c4680;
  local_58.halfedgeNormals_._M_t._M_impl._0_8_ = 0;
  local_58.halfedgeNormals_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58.halfedgeNormals_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_58.halfedgeNormals_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58.halfedgeNormals_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58.mesh_ = _mesh;
  local_58.halfedgeNormals_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58.halfedgeNormals_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this = (_IOManager_ *)IOManager(this_00);
  uVar1 = _IOManager_::read(this,(string *)_filename,&local_58.super_BaseImporter,_opt);
  ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::~ImporterT(&local_58);
  return (bool)uVar1;
}

Assistant:

bool
read_mesh(Mesh&         _mesh,
	  const std::string&  _filename,
	  Options&            _opt,
	  bool                _clear = true)
{
  if (_clear) _mesh.clear();
  ImporterT<Mesh> importer(_mesh);
  return IOManager().read(_filename, importer, _opt);
}